

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifilt.cpp
# Opt level: O0

UMatchDegree __thiscall
icu_63::UnicodeFilter::matches
          (UnicodeFilter *this,Replaceable *text,int32_t *offset,int32_t limit,UBool incremental)

{
  uint uVar1;
  int iVar2;
  UChar32 c;
  UBool incremental_local;
  int32_t limit_local;
  int32_t *offset_local;
  Replaceable *text_local;
  UnicodeFilter *this_local;
  
  if (*offset < limit) {
    uVar1 = Replaceable::char32At(text,*offset);
    iVar2 = (*(this->super_UnicodeFunctor).super_UObject._vptr_UObject[7])();
    if ((char)iVar2 != '\0') {
      iVar2 = 2;
      if (uVar1 < 0x10000) {
        iVar2 = 1;
      }
      *offset = iVar2 + *offset;
      return U_MATCH;
    }
  }
  if (limit < *offset) {
    Replaceable::char32At(text,*offset);
    iVar2 = (*(this->super_UnicodeFunctor).super_UObject._vptr_UObject[7])();
    if ((char)iVar2 != '\0') {
      *offset = *offset + -1;
      if (-1 < *offset) {
        uVar1 = Replaceable::char32At(text,*offset);
        iVar2 = 2;
        if (uVar1 < 0x10000) {
          iVar2 = 1;
        }
        *offset = *offset - (iVar2 + -1);
      }
      return U_MATCH;
    }
  }
  if ((incremental == '\0') || (*offset != limit)) {
    this_local._4_4_ = U_MISMATCH;
  }
  else {
    this_local._4_4_ = U_PARTIAL_MATCH;
  }
  return this_local._4_4_;
}

Assistant:

UMatchDegree UnicodeFilter::matches(const Replaceable& text,
                                    int32_t& offset,
                                    int32_t limit,
                                    UBool incremental) {
    UChar32 c;
    if (offset < limit &&
        contains(c = text.char32At(offset))) {
        offset += U16_LENGTH(c);
        return U_MATCH;
    }
    if (offset > limit &&
        contains(c = text.char32At(offset))) {
        // Backup offset by 1, unless the preceding character is a
        // surrogate pair -- then backup by 2 (keep offset pointing at
        // the lead surrogate).
        --offset;
        if (offset >= 0) {
            offset -= U16_LENGTH(text.char32At(offset)) - 1;
        }
        return U_MATCH;
    }
    if (incremental && offset == limit) {
        return U_PARTIAL_MATCH;
    }
    return U_MISMATCH;
}